

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O3

Error __thiscall
asmjit::v1_14::CodeHolder::newRelocEntry(CodeHolder *this,RelocEntry **dst,RelocType relocType)

{
  CodeBuffer *cb;
  int iVar1;
  uint uVar2;
  OffsetFormat OVar3;
  long lVar4;
  OffsetFormat OVar5;
  undefined1 uVar6;
  bool bVar7;
  Error EVar8;
  uint uVar9;
  RelocEntry *pRVar10;
  ExpressionValueType *pEVar11;
  Value VVar12;
  ulong uVar13;
  Value VVar14;
  long lVar15;
  ulong uVar16;
  ExpressionValueType *pEVar17;
  Section *pSVar18;
  bool bVar19;
  ulong uVar20;
  Value self;
  ZoneAllocator *allocator;
  CodeHolder *self_00;
  CodeHolder *pCVar21;
  long lVar22;
  CodeHolder *dst_00;
  OffsetFormat *unaff_R13;
  Value *pVVar23;
  Value aVStack_100 [2];
  Value VStack_f0;
  Value VStack_e8;
  Value VStack_e0;
  Section *pSStack_d8;
  CodeHolder *pCStack_d0;
  OffsetFormat *pOStack_c8;
  CodeHolder *pCStack_c0;
  Value VStack_b8;
  code *pcStack_b0;
  Arch AStack_a1;
  ulong uStack_a0;
  Section *pSStack_98;
  Value VStack_90;
  uint8_t *puStack_88;
  Value VStack_80;
  ulong uStack_78;
  RelocEntry **ppRStack_70;
  CodeHolder *pCStack_68;
  size_t local_30;
  
  uVar20 = (ulong)relocType;
  allocator = &this->_allocator;
  uVar9 = *(uint *)&this->field_0x110;
  if (*(uint *)&this->field_0x114 == uVar9) {
    EVar8 = ZoneVectorBase::_grow((ZoneVectorBase *)&this->_relocations,allocator,8,1);
    if (EVar8 != 0) {
      return EVar8;
    }
    uVar9 = *(uint *)&this->field_0x110;
  }
  dst_00 = (CodeHolder *)(ulong)uVar9;
  if (uVar9 == 0xffffffff) {
    EVar8 = 0x16;
  }
  else {
    if (*(long *)allocator == 0) {
      newRelocEntry();
    }
    else {
      pRVar10 = (RelocEntry *)ZoneAllocator::_allocZeroed(allocator,0x28,&local_30);
      if (pRVar10 != (RelocEntry *)0x0) {
        pRVar10->_id = uVar9;
        pRVar10->_relocType = relocType;
        pRVar10->_sourceSectionId = 0xffffffff;
        pRVar10->_targetSectionId = 0xffffffff;
        if (*(uint *)&this->field_0x110 < *(uint *)&this->field_0x114) {
          *(RelocEntry **)(*(long *)&this->_relocations + (ulong)*(uint *)&this->field_0x110 * 8) =
               pRVar10;
          *(int *)&this->field_0x110 = *(int *)&this->field_0x110 + 1;
          *dst = pRVar10;
          return 0;
        }
        newRelocEntry();
        if ((ulong)*(uint *)(allocator + 0xf0) == 0) {
          uVar9 = 0;
        }
        else {
          lVar15 = 0;
          self_00 = (CodeHolder *)0x0;
          VVar14._0_1_ = kSignedOffset;
          VVar14._1_1_ = '\0';
          VVar14._2_1_ = '\0';
          VVar14._3_1_ = '\0';
          VVar14._4_1_ = '\0';
          VVar14._5_1_ = '\0';
          VVar14._6_1_ = '\0';
          VVar14._7_1_ = '\0';
          do {
            lVar22 = *(long *)(*(long *)(allocator + 0xe8) + lVar15);
            uVar16 = *(ulong *)(lVar22 + 0x50);
            if (*(ulong *)(lVar22 + 0x50) < *(ulong *)(lVar22 + 0x18)) {
              uVar16 = *(ulong *)(lVar22 + 0x18);
            }
            if (uVar16 != 0) {
              pCVar21 = (CodeHolder *)
                        (-(ulong)*(uint *)(lVar22 + 8) &
                        (long)self_00 + ((ulong)*(uint *)(lVar22 + 8) - 1));
              if (pCVar21 < self_00) {
                codeSize();
                if ((OffsetFormat)VVar14.constant == (OffsetFormat)0xffffffffffffffff)
                goto LAB_0011924f;
                self_00->_baseAddress = (uint64_t)VVar14;
                AStack_a1 = (self_00->_environment)._arch;
                pSVar18 = self_00->_addressTableSection;
                VVar12 = VVar14;
                pCVar21 = self_00;
                ppRStack_70 = dst;
                pCStack_68 = dst_00;
                if (pSVar18 == (Section *)0x0) {
                  puStack_88 = (uint8_t *)0x0;
                }
                else {
                  cb = &pSVar18->_buffer;
                  if ((pSVar18->_buffer)._capacity < pSVar18->_virtualSize) {
                    uVar20 = 9;
                    if (((pSVar18->_buffer)._flags & kIsFixed) != kNone) goto LAB_00119229;
                    pcStack_b0 = (code *)0x118f4e;
                    VVar12 = (Value)cb;
                    EVar8 = CodeHolder_reserveInternal(self_00,cb,pSVar18->_virtualSize);
                    uVar20 = (ulong)EVar8;
                    if (EVar8 != 0) goto LAB_00119229;
                  }
                  puStack_88 = cb->_data;
                  dst_00 = (CodeHolder *)cb;
                }
                uStack_a0 = 0;
                pSStack_98 = pSVar18;
                VStack_90 = VVar14;
                if ((ulong)*(uint *)&self_00->field_0x110 == 0) goto LAB_001191ea;
                pSVar18 = (Section *)
                          ((*(Value *)&self_00->_relocations)->valueType +
                          (ulong)*(uint *)&self_00->field_0x110 * 8 + -1);
                uStack_78 = (ulong)(AStack_a1 & k32BitMask) ^ 3;
                uStack_a0 = 0;
                uVar20 = 0x17;
                VVar14.expression = *(Value *)&self_00->_relocations;
                goto LAB_00118fcd;
              }
              self_00 = (CodeHolder *)(&(pCVar21->_environment)._arch + uVar16);
              VVar14._0_1_ = (OffsetType)VVar14.constant | CARRY8((ulong)pCVar21,uVar16);
              VVar14.constant._1_7_ = 0;
            }
            lVar15 = lVar15 + 8;
          } while ((ulong)*(uint *)(allocator + 0xf0) << 3 != lVar15);
          uVar9 = -(uint)((OffsetType)VVar14.constant != kSignedOffset) | (uint)self_00;
        }
        return uVar9;
      }
    }
    EVar8 = 1;
  }
  return EVar8;
LAB_00118fcd:
  do {
    unaff_R13 = *(OffsetFormat **)VVar14.expression;
    iVar1 = *(int *)&unaff_R13->_valueOffset;
    if (iVar1 != 0) {
      uVar9._0_1_ = unaff_R13[2]._type;
      uVar9._1_1_ = unaff_R13[2]._flags;
      uVar9._2_1_ = unaff_R13[2]._regionSize;
      uVar9._3_1_ = unaff_R13[2]._valueSize;
      if (*(uint *)&self_00->field_0xe0 <= uVar9) {
        pcStack_b0 = (code *)0x11924a;
        relocateToBase();
LAB_0011924a:
        pcStack_b0 = (code *)0x11924f;
        relocateToBase();
LAB_0011924f:
        uVar20 = 2;
        goto LAB_00119229;
      }
      lVar15 = *(long *)(*(long *)&self_00->_sections + (ulong)uVar9 * 8);
      uVar2._0_1_ = unaff_R13[2]._valueOffset;
      uVar2._1_1_ = unaff_R13[2]._immBitCount;
      uVar2._2_1_ = unaff_R13[2]._immBitShift;
      uVar2._3_1_ = unaff_R13[2]._immDiscardLsb;
      if ((ulong)uVar2 == 0xffffffff) {
        lVar22 = 0;
      }
      else {
        if (*(uint *)&self_00->field_0xe0 <= uVar2) goto LAB_0011924a;
        lVar22 = *(long *)(*(long *)&self_00->_sections + (ulong)uVar2 * 8);
      }
      self = (Value)((Value *)(unaff_R13 + 4))->expression;
      OVar3 = unaff_R13[3];
      if ((((ulong)*(OffsetFormat *)(lVar15 + 0x50) <= (ulong)OVar3) ||
          (pCVar21 = (CodeHolder *)(ulong)unaff_R13[1]._regionSize,
          (CodeHolder *)((long)*(OffsetFormat *)(lVar15 + 0x50) - (long)OVar3) < pCVar21)) ||
         (4 < iVar1 - 1U)) goto LAB_00119229;
      lVar4 = *(long *)(lVar15 + 0x10);
      dst_00 = *(CodeHolder **)(lVar15 + 0x48);
      VVar12 = self;
      VStack_80 = self;
      switch(iVar1) {
      case 1:
        pcStack_b0 = (code *)0x119072;
        EVar8 = CodeHolder_evaluateExpression
                          ((CodeHolder *)self.expression,(Expression *)&VStack_80,
                           (uint64_t *)&switchD_00119063::switchdataD_0014c3c0);
        VVar12 = VStack_80;
        if (EVar8 != 0) {
          uVar20 = (ulong)EVar8;
          goto LAB_00119229;
        }
        break;
      case 3:
        if (lVar22 == 0) goto LAB_00119229;
        VVar12.expression =
             (Expression *)
             ((self.expression)->valueType + (long)(VStack_90.constant - 1) +
             *(long *)(lVar22 + 0x10));
        break;
      case 4:
        VVar12.expression =
             (Expression *)
             ((long)self.expression -
             (long)((VStack_90.expression)->valueType + (long)pCVar21 + lVar4 + (long)OVar3 + -1));
        if ((AStack_a1 & k32BitMask) == kUnknown) {
          if ((long)(int)VVar12.constant != VVar12.constant) {
LAB_0011923e:
            uVar20 = 0x18;
            goto LAB_00119229;
          }
        }
        else {
          VVar12 = (Value)(long)(int)VVar12.constant;
        }
        break;
      case 5:
        if ((unaff_R13[1]._valueSize != '\x04') ||
           (uVar16 = (ulong)unaff_R13[1]._valueOffset + (long)OVar3, uVar16 < 2)) goto LAB_00119229;
        VVar12.expression =
             (Expression *)
             ((long)self.expression -
             (long)((VStack_90.expression)->valueType + (long)pCVar21 + lVar4 + (long)OVar3 + -1));
        if ((long)(int)VVar12.constant != VVar12.constant) {
          uVar13 = *(ulong *)&self_00->_addressTableEntries;
          while( true ) {
            if (uVar13 == 0) goto LAB_00119229;
            OVar5 = *(OffsetFormat *)(uVar13 + 0x10);
            uVar9 = (uint)((ulong)OVar5 >= self.constant && OVar5 != (OffsetFormat)self.constant) -
                    (uint)((ulong)OVar5 < self.constant);
            if (uVar9 == 0) break;
            uVar13 = *(ulong *)(uVar13 + (ulong)(uVar9 >> 0x1f) * 8) & 0xfffffffffffffffe;
          }
          if (pSStack_98 == (Section *)0x0) goto LAB_00119260;
          uVar9 = *(uint *)(uVar13 + 0x18);
          if (uVar9 == 0xffffffff) {
            uVar9 = (uint)uStack_a0;
            *(uint *)(uVar13 + 0x18) = uVar9;
            uStack_a0 = (ulong)(uVar9 + 1);
          }
          lVar15 = (ulong)uVar9 << ((byte)uStack_78 & 0x3f);
          VVar12.expression =
               (Expression *)
               (pSStack_98->_offset +
               (lVar15 - (long)(&(pCVar21->_environment)._arch + (long)OVar3 + lVar4)));
          if ((long)(int)VVar12.constant != VVar12.constant) goto LAB_0011923e;
          uVar6 = 0x15;
          if ((&dst_00[-1].field_0x157)[uVar16] != -0x18) {
            if ((&dst_00[-1].field_0x157)[uVar16] != -0x17) goto LAB_00119229;
            uVar6 = 0x25;
          }
          (&dst_00[-1].field_0x156)[uVar16] = 0xff;
          (&dst_00[-1].field_0x157)[uVar16] = uVar6;
          *(OffsetFormat *)(puStack_88 + lVar15) = unaff_R13[4];
        }
      }
      dst_00 = (CodeHolder *)(&(dst_00->_environment)._arch + (long)unaff_R13[3]);
      unaff_R13 = unaff_R13 + 1;
      pcStack_b0 = (code *)0x1191d9;
      pCVar21 = dst_00;
      bVar7 = CodeWriterUtils::writeOffset(dst_00,VVar12.constant,unaff_R13);
      if (!bVar7) goto LAB_00119229;
    }
    VVar14.expression = (Expression *)(VVar14.expression)->value;
  } while ((Section *)VVar14.constant != pSVar18);
LAB_001191ea:
  if (*(int *)&self_00->field_0xf0 == 0) {
    pcStack_b0 = (code *)0x11925b;
    relocateToBase();
    self = VVar12;
  }
  else {
    uVar20 = 0;
    if (*(Section **)
         (*(long *)&self_00->_sectionsByOrder + (ulong)(*(int *)&self_00->field_0xf0 - 1) * 8) !=
        pSStack_98) {
LAB_00119229:
      return (Error)uVar20;
    }
    self = VVar12;
    if (pSStack_98 != (Section *)0x0) {
      uVar16 = (ulong)(uint)((int)uStack_a0 << (AStack_a1 & k32BitMask ^ kRISCV32));
      (pSStack_98->_buffer)._size = uVar16;
      pSStack_98->_virtualSize = uVar16;
      goto LAB_00119229;
    }
  }
  pcStack_b0 = (code *)0x119260;
  relocateToBase();
LAB_00119260:
  pcStack_b0 = CodeHolder_evaluateExpression;
  relocateToBase();
  lVar15 = 0;
  pVVar23 = aVStack_100;
  bVar7 = true;
  VStack_f0 = self;
  pSStack_d8 = pSVar18;
  pCStack_d0 = dst_00;
  pOStack_c8 = unaff_R13;
  pCStack_c0 = self_00;
  VStack_b8 = VVar14;
  pcStack_b0 = (code *)uVar20;
  do {
    bVar19 = bVar7;
    VVar12.constant._1_7_ = 0;
    VVar12.constant._0_1_ = (&(pCVar21->_environment)._subArch)[lVar15];
    if (3 < VVar12.constant) {
      return 3;
    }
    switch(VVar12.constant) {
    case 1:
      VVar12 = *(Value *)(&pCVar21->_cpuFeatures + lVar15 * 8);
      break;
    case 2:
      lVar22 = *(long *)(*(long *)(&pCVar21->_cpuFeatures + lVar15 * 8) + 0x20);
      if (lVar22 == 0) {
        return 0x43;
      }
      VVar12.expression =
           (Expression *)
           (*(long *)(*(long *)(&pCVar21->_cpuFeatures + lVar15 * 8) + 0x18) +
           *(long *)(lVar22 + 0x10));
      break;
    case 3:
      EVar8 = CodeHolder_evaluateExpression
                        (*(CodeHolder **)(&pCVar21->_cpuFeatures + lVar15 * 8),
                         (Expression *)&VStack_e0,
                         (uint64_t *)
                         ((long)&switchD_001192a7::switchdataD_0014c3d4 +
                         (long)(int)(&switchD_001192a7::switchdataD_0014c3d4)[VVar12.constant]));
      VVar12 = VStack_e0;
      if (EVar8 != 0) {
        return EVar8;
      }
    }
    pVVar23->constant = (uint64_t)VVar12;
    lVar15 = 1;
    pVVar23 = &VStack_e8;
    bVar7 = false;
  } while (bVar19);
  switch((pCVar21->_environment)._arch) {
  case kUnknown:
    pEVar11 = (VStack_e8.expression)->valueType + (aVStack_100[0].constant - 1);
    break;
  case k32BitMask:
    pEVar11 = (ExpressionValueType *)((long)aVStack_100[0].expression - (long)VStack_e8);
    break;
  case kHost:
    pEVar11 = (ExpressionValueType *)(VStack_e8.constant * aVStack_100[0].constant);
    break;
  case kRISCV32:
    pEVar17 = (ExpressionValueType *)(aVStack_100[0].constant << ((byte)VStack_e8.constant & 0x3f));
    goto LAB_00119352;
  case kRISCV64:
    pEVar17 = (ExpressionValueType *)(aVStack_100[0].constant >> ((byte)VStack_e8.constant & 0x3f));
LAB_00119352:
    pEVar11 = (ExpressionValueType *)0x0;
    if (VStack_e8.constant < 0x40) {
      pEVar11 = pEVar17;
    }
    break;
  case kARM:
    VVar14.constant = 0x3f;
    if (VStack_e8.constant < 0x3f) {
      VVar14 = VStack_e8;
    }
    pEVar11 = (ExpressionValueType *)
              ((long)aVStack_100[0].constant >> ((byte)VVar14.constant & 0x3f));
    break;
  default:
    return 3;
  }
  *(ExpressionValueType **)VStack_f0.expression = pEVar11;
  return 0;
}

Assistant:

Error CodeHolder::newRelocEntry(RelocEntry** dst, RelocType relocType) noexcept {
  ASMJIT_PROPAGATE(_relocations.willGrow(&_allocator));

  uint32_t relocId = _relocations.size();
  if (ASMJIT_UNLIKELY(relocId == Globals::kInvalidId))
    return DebugUtils::errored(kErrorTooManyRelocations);

  RelocEntry* re = _allocator.allocZeroedT<RelocEntry>();
  if (ASMJIT_UNLIKELY(!re))
    return DebugUtils::errored(kErrorOutOfMemory);

  re->_id = relocId;
  re->_relocType = relocType;
  re->_sourceSectionId = Globals::kInvalidId;
  re->_targetSectionId = Globals::kInvalidId;
  _relocations.appendUnsafe(re);

  *dst = re;
  return kErrorOk;
}